

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_uc_hooksys64_aarch64(CPUARMState_conflict *env,uint32_t insn,void *hk)

{
  uint32_t uVar1;
  uint32_t local_58;
  uint32_t rt;
  uc_arm64_cp_reg cp_reg;
  hook *hook;
  uc_arm64_reg uc_rt;
  void *hk_local;
  uint32_t insn_local;
  CPUARMState_conflict *env_local;
  
  if ((*(byte *)((long)hk + 0x14) & 1) == 0) {
    cp_reg.val = (uint64_t)hk;
    uVar1 = extract32(insn,0,5);
    cp_reg.crn = extract32(insn,0x13,2);
    cp_reg.crm = extract32(insn,0x10,3);
    local_58 = extract32(insn,0xc,4);
    rt = extract32(insn,8,4);
    cp_reg.op0 = extract32(insn,5,3);
    if (uVar1 < 0x1d) {
      hook._4_4_ = uVar1 + 199;
      cp_reg._16_8_ = env->xregs[uVar1];
    }
    else if (uVar1 == 0x1d) {
      hook._4_4_ = 1;
      cp_reg._16_8_ = env->xregs[0x1d];
    }
    else if (uVar1 == 0x1e) {
      hook._4_4_ = 2;
      cp_reg._16_8_ = env->xregs[0x1e];
    }
    else {
      hook._4_4_ = 7;
      cp_reg.op2 = 0;
      cp_reg._20_4_ = 0;
    }
    env_local._4_4_ =
         (**(code **)(cp_reg.val + 0x28))
                   (env->uc,hook._4_4_,&local_58,*(undefined8 *)(cp_reg.val + 0x30));
  }
  else {
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

uint32_t HELPER(uc_hooksys64)(CPUARMState *env, uint32_t insn, void *hk)
{
    uc_arm64_reg uc_rt;
    struct hook *hook = (struct hook*)hk;
    uc_arm64_cp_reg cp_reg;
    uint32_t rt;

    if (hook->to_delete) {
        return 0;
    }

    rt = extract32(insn, 0, 5);
    cp_reg.op0 = extract32(insn, 19, 2);
    cp_reg.op1 = extract32(insn, 16, 3);
    cp_reg.crn = extract32(insn, 12, 4);
    cp_reg.crm = extract32(insn, 8, 4);
    cp_reg.op2 = extract32(insn, 5, 3);

    if (rt <= 28 && rt >= 0) {
        uc_rt = UC_ARM64_REG_X0 + rt;
        cp_reg.val = env->xregs[rt];
    } else if (rt == 29 ) {
        uc_rt = UC_ARM64_REG_X29;
        cp_reg.val = env->xregs[29];
    } else if (rt == 30) {
        uc_rt = UC_ARM64_REG_X30;
        cp_reg.val = env->xregs[30];
    } else {
        uc_rt = UC_ARM64_REG_XZR;
        cp_reg.val = 0;
    }

    return ((uc_cb_insn_sys_t)(hook->callback))(env->uc, uc_rt, &cp_reg, hook->user_data);
}